

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__ci
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  StackMemoryManager *this_00;
  uint uVar1;
  ParserChar *text;
  size_t sVar2;
  bool bVar3;
  ci__AttributeData *pcVar4;
  StringHash SVar5;
  char **ppcVar6;
  char cVar7;
  xmlChar **ppxVar8;
  bool failed;
  ParserChar *attributeValue;
  bool local_139;
  ParserChar *local_138;
  URI *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  pcVar4 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::ci__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    local_120 = &pcVar4->href;
    local_128 = &pcVar4->_class;
    local_130 = &pcVar4->definitionURL;
    this_00 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        cVar7 = '\x03';
      }
      else {
        SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_138 = ppxVar8[1];
        if ((long)SVar5 < 0x593f0c) {
          if ((long)SVar5 < 0x7c065) {
            if (SVar5 == 0x6f4) {
              pcVar4->id = local_138;
            }
            else {
              if (SVar5 == 0x6f8b6) {
                GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
                COLLADABU::URI::operator=(local_120,&local_118);
                COLLADABU::URI::~URI(&local_118);
                if ((local_139 == true) &&
                   (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                       ERROR_ATTRIBUTE_PARSING_FAILED,0x699,0x6f8b6,local_138),
                   bVar3)) goto LAB_00750ade;
                cVar7 = '\x04';
                bVar3 = true;
                if (local_139 == false) {
                  *(byte *)&pcVar4->present_attributes = (byte)pcVar4->present_attributes | 4;
                }
                goto LAB_00750b25;
              }
LAB_00750afa:
              if ((pcVar4->unknownAttributes).data == (char **)0x0) {
                ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
              }
              else {
                ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
              }
              (pcVar4->unknownAttributes).data = ppcVar6;
              sVar2 = (pcVar4->unknownAttributes).size;
              ppcVar6[sVar2] = text;
              (pcVar4->unknownAttributes).data[sVar2 + 1] = local_138;
              (pcVar4->unknownAttributes).size = sVar2 + 2;
            }
          }
          else if (SVar5 == 0x7c065) {
            pcVar4->type = local_138;
          }
          else {
            if (SVar5 != 0x7f8b6) goto LAB_00750afa;
            pcVar4->xref = local_138;
          }
LAB_00750b96:
          cVar7 = '\0';
        }
        else {
          if (0x7ac024 < (long)SVar5) {
            if (SVar5 == 0x7ac025) {
              pcVar4->style = local_138;
            }
            else {
              if (SVar5 != 0x4a5aa87) goto LAB_00750afa;
              pcVar4->encoding = local_138;
            }
            goto LAB_00750b96;
          }
          if (SVar5 == 0x593f0c) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
            COLLADABU::URI::operator=(local_130,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if ((local_139 == true) &&
               (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x699,0x593f0c,local_138), bVar3))
            {
LAB_00750ade:
              bVar3 = false;
              cVar7 = '\x01';
            }
            else {
              cVar7 = '\x04';
              bVar3 = true;
              if (local_139 == false) {
                *(byte *)&pcVar4->present_attributes = (byte)pcVar4->present_attributes | 1;
              }
            }
LAB_00750b25:
            if (bVar3) goto LAB_00750b96;
          }
          else {
            if (SVar5 != 0x6a28a3) goto LAB_00750afa;
            bVar3 = GeneratedSaxParser::
                    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                    ::
                    characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                              (&this->
                                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ,local_138,local_128);
            if (bVar3) {
              *(byte *)&pcVar4->present_attributes = (byte)pcVar4->present_attributes | 2;
              cVar7 = '\x04';
              bVar3 = true;
            }
            else {
              bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x699,0x6a28a3,local_138);
              bVar3 = !bVar3;
              cVar7 = bVar3 * '\x03' + '\x01';
            }
            if (bVar3) goto LAB_00750b96;
          }
        }
        ppxVar8 = ppxVar8 + 2;
      }
    } while (cVar7 == '\0');
    if (cVar7 != '\x03') {
      return false;
    }
  }
  if ((pcVar4->present_attributes & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pcVar4->definitionURL,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  uVar1 = pcVar4->present_attributes;
  if ((uVar1 & 2) == 0) {
    (pcVar4->_class).data = (ParserString *)0x0;
    (pcVar4->_class).size = 0;
  }
  if ((uVar1 & 4) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pcVar4->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__ci( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__ci( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

ci__AttributeData* attributeData = newData<ci__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CI,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= ci__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_CI, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CI,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_CI,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= ci__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CI,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= ci__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & ci__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}
if ((attributeData->present_attributes & ci__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & ci__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}